

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall blc::network::Server::resume(Server *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x28));
  if (iVar1 == 0) {
    this[0x20] = (Server)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x28));
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void blc::network::Server::resume() {
	this->_mutex.lock();
	this->_stop = false;
	this->_mutex.unlock();
}